

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O1

Month month_of_day(DaysInYear days_in_year)

{
  uint uVar1;
  Month MVar2;
  int iVar3;
  bool bVar4;
  
  iVar3 = days_in_year.year;
  days_in_months(iVar3);
  if (((ulong)days_in_year & 3) == 0) {
    uVar1 = iVar3 * -0x3d70a3d7 + 0x51eb850;
    bVar4 = true;
    if ((uVar1 >> 2 | iVar3 * 0x40000000) < 0x28f5c29) {
      bVar4 = (uVar1 >> 4 | iVar3 * -0x70000000) < 0xa3d70b;
    }
  }
  else {
    bVar4 = false;
  }
  MVar2 = jan;
  iVar3 = days_in_year.days;
  if ((((((0x1e < iVar3) && (MVar2 = feb, (int)(bVar4 + 0x3b) <= iVar3)) &&
        (MVar2 = mar, (int)(bVar4 + 0x5a) <= iVar3)) &&
       ((MVar2 = apr, (int)(bVar4 + 0x78) <= iVar3 && (MVar2 = may, (int)(bVar4 + 0x97) <= iVar3))))
      && ((MVar2 = jun, (int)(bVar4 + 0xb5) <= iVar3 &&
          ((MVar2 = jul, (int)(bVar4 + 0xd4) <= iVar3 && (MVar2 = aug, (int)(bVar4 + 0xf3) <= iVar3)
           ))))) &&
     ((MVar2 = sep, (int)(bVar4 + 0x111) <= iVar3 && (MVar2 = oct, (int)(bVar4 + 0x130) <= iVar3))))
  {
    MVar2 = ((int)(bVar4 | 0x14e) <= iVar3) + nov;
  }
  return MVar2;
}

Assistant:

Month month_of_day(DaysInYear days_in_year)
{
	auto d = days_in_year.days;
	auto y = days_in_year.year;
	auto months = days_in_months(y);
	auto leap_additive = leapyear(y) ? 1 : 0;
	if (d < 31)
		return Month::jan;
	else if (d < 59 + leap_additive)
		return Month::feb;
	else if (d < 90 + leap_additive)
		return Month::mar;
	else if (d < 120 + leap_additive)
		return Month::apr;
	else if (d < 151 + leap_additive)
		return Month::may;
	else if (d < 181 + leap_additive)
		return Month::jun;
	else if (d < 212 + leap_additive)
		return Month::jul;
	else if (d < 243 + leap_additive)
		return Month::aug;
	else if (d < 273 + leap_additive)
		return Month::sep;
	else if (d < 304 + leap_additive)
		return Month::oct;
	else if (d < 334 + leap_additive)
		return Month::nov;
	else
		return Month::dec;
}